

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WriteValue<duckdb::PersistentRowGroupData>
          (Serializer *this,vector<duckdb::PersistentRowGroupData,_true> *vec)

{
  pointer pPVar1;
  PersistentRowGroupData *item;
  pointer this_00;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                        ).
                        super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                        ).
                        super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 6);
  pPVar1 = (vec->
           super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
           ).
           super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (vec->
                 super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                 ).
                 super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1
      ) {
    (*this->_vptr_Serializer[6])(this);
    PersistentRowGroupData::Serialize(this_00,this);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}